

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall brynet::net::EventLoop::pushAsyncProc(EventLoop *this,USER_PROC *f)

{
  bool bVar1;
  
  bVar1 = isInLoopThread(this);
  if (bVar1) {
    std::function<void_()>::operator()(f);
    return;
  }
  std::mutex::lock(&this->mAsyncProcsMutex);
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
             &this->mAsyncProcs,f);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mAsyncProcsMutex);
  wakeup(this);
  return;
}

Assistant:

void EventLoop::pushAsyncProc(USER_PROC f)
{
    if (isInLoopThread())
    {
        f();
    }
    else
    {
        {
            std::lock_guard<std::mutex> lck(mAsyncProcsMutex);
            mAsyncProcs.emplace_back(std::move(f));
        }
        wakeup();
    }
}